

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandTrackingMeshFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string indices_prefix;
  string indexcountoutput_prefix;
  string indexcapacityinput_prefix;
  string vertexblendweights_prefix;
  string vertexblendindices_prefix;
  string vertexuvs_prefix;
  string vertexnormals_prefix;
  string vertexpositions_prefix;
  string vertexcountoutput_prefix;
  string vertexcapacityinput_prefix;
  string jointparents_prefix;
  string jointradii_prefix;
  string jointbindposes_prefix;
  string jointcountoutput_prefix;
  string jointcapacityinput_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1678;
  string local_1658;
  ostringstream oss_jointCapacityInput;
  ostringstream oss_indices;
  uint auStack_14a8 [88];
  ostringstream oss_vertexBlendWeights;
  uint auStack_1330 [88];
  ostringstream oss_vertexBlendIndices;
  uint auStack_11b8 [88];
  ostringstream oss_vertexUVs;
  uint auStack_1040 [88];
  ostringstream oss_vertexNormals;
  uint auStack_ec8 [88];
  ostringstream oss_vertexPositions;
  uint auStack_d50 [88];
  ostringstream oss_jointParents;
  uint auStack_bd8 [88];
  ostringstream oss_jointBindPoses;
  uint auStack_a60 [88];
  ostringstream oss_jointRadii;
  undefined8 local_8f8 [46];
  ostringstream oss_indexCountOutput;
  ostringstream oss_indexCapacityInput;
  ostringstream oss_vertexCountOutput;
  ostringstream oss_vertexCapacityInput;
  ostringstream oss_jointCountOutput;
  
  PointerToHexString<XrHandTrackingMeshFB>((XrHandTrackingMeshFB *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_jointCapacityInput);
  std::__cxx11::string::~string((string *)&oss_jointCapacityInput);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_jointCapacityInput,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_jointCapacityInput);
    std::__cxx11::string::~string((string *)&oss_jointCapacityInput);
  }
  else {
    _oss_jointCapacityInput = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_jointCapacityInput);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_jointCapacityInput);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_1658,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1658,contents);
  std::__cxx11::string::~string((string *)&local_1658);
  if (bVar2) {
    std::__cxx11::string::string((string *)&jointcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_jointCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&jointcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_jointCountOutput);
    std::__cxx11::string::~string((string *)&oss_jointCountOutput);
    std::__cxx11::string::string((string *)&jointcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_jointCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&jointcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_jointBindPoses);
    std::__cxx11::string::~string((string *)&oss_jointBindPoses);
    std::__cxx11::string::string((string *)&jointbindposes_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointbindposes_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointBindPoses);
    *(uint *)((long)auStack_a60 + *(long *)(_oss_jointBindPoses + -0x18)) =
         *(uint *)((long)auStack_a60 + *(long *)(_oss_jointBindPoses + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_jointBindPoses);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrPosef*",&jointbindposes_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_jointRadii)
    ;
    std::__cxx11::string::~string((string *)&oss_jointRadii);
    std::__cxx11::string::string((string *)&jointradii_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointradii_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointRadii);
    *(undefined8 *)((long)local_8f8 + *(long *)(_oss_jointRadii + -0x18)) = 0x20;
    std::ostream::_M_insert<void_const*>(&oss_jointRadii);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])0x212c5d,&jointradii_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_jointParents);
    std::__cxx11::string::~string((string *)&oss_jointParents);
    std::__cxx11::string::string((string *)&jointparents_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&jointparents_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_jointParents);
    *(uint *)((long)auStack_bd8 + *(long *)(_oss_jointParents + -0x18)) =
         *(uint *)((long)auStack_bd8 + *(long *)(_oss_jointParents + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_jointParents);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrHandJointEXT*",&jointparents_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexCapacityInput);
    std::__cxx11::string::~string((string *)&oss_vertexCapacityInput);
    std::__cxx11::string::string((string *)&vertexcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_vertexCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&vertexcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexCountOutput);
    std::__cxx11::string::~string((string *)&oss_vertexCountOutput);
    std::__cxx11::string::string((string *)&vertexcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_vertexCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&vertexcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexPositions);
    std::__cxx11::string::~string((string *)&oss_vertexPositions);
    std::__cxx11::string::string((string *)&vertexpositions_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexpositions_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexPositions);
    *(uint *)((long)auStack_d50 + *(long *)(_oss_vertexPositions + -0x18)) =
         *(uint *)((long)auStack_d50 + *(long *)(_oss_vertexPositions + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_vertexPositions);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])0x2122a1,&vertexpositions_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexNormals);
    std::__cxx11::string::~string((string *)&oss_vertexNormals);
    std::__cxx11::string::string((string *)&vertexnormals_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexnormals_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexNormals);
    *(uint *)((long)auStack_ec8 + *(long *)(_oss_vertexNormals + -0x18)) =
         *(uint *)((long)auStack_ec8 + *(long *)(_oss_vertexNormals + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_vertexNormals);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])0x2122a1,&vertexnormals_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_vertexUVs);
    std::__cxx11::string::~string((string *)&oss_vertexUVs);
    std::__cxx11::string::string((string *)&vertexuvs_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexuvs_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexUVs);
    *(uint *)((long)auStack_1040 + *(long *)(_oss_vertexUVs + -0x18)) =
         *(uint *)((long)auStack_1040 + *(long *)(_oss_vertexUVs + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_vertexUVs);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&vertexuvs_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexBlendIndices);
    std::__cxx11::string::~string((string *)&oss_vertexBlendIndices);
    std::__cxx11::string::string((string *)&vertexblendindices_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexblendindices_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexBlendIndices);
    *(uint *)((long)auStack_11b8 + *(long *)(_oss_vertexBlendIndices + -0x18)) =
         *(uint *)((long)auStack_11b8 + *(long *)(_oss_vertexBlendIndices + -0x18)) & 0xffffffb5 | 8
    ;
    std::ostream::_M_insert<void_const*>(&oss_vertexBlendIndices);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[14],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [14])"XrVector4sFB*",&vertexblendindices_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexBlendWeights);
    std::__cxx11::string::~string((string *)&oss_vertexBlendWeights);
    std::__cxx11::string::string((string *)&vertexblendweights_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexblendweights_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexBlendWeights);
    *(uint *)((long)auStack_1330 + *(long *)(_oss_vertexBlendWeights + -0x18)) =
         *(uint *)((long)auStack_1330 + *(long *)(_oss_vertexBlendWeights + -0x18)) & 0xffffffb5 | 8
    ;
    std::ostream::_M_insert<void_const*>(&oss_vertexBlendWeights);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector4f*",&vertexblendweights_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_indexCapacityInput);
    std::__cxx11::string::~string((string *)&oss_indexCapacityInput);
    std::__cxx11::string::string((string *)&indexcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indexcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_indexCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&indexcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_indexCountOutput);
    std::__cxx11::string::~string((string *)&oss_indexCountOutput);
    std::__cxx11::string::string((string *)&indexcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indexcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_indexCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&indexcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indices);
    std::__cxx11::string::~string((string *)&oss_indices);
    std::__cxx11::string::string((string *)&indices_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indices_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indices);
    *(uint *)((long)auStack_14a8 + *(long *)(_oss_indices + -0x18)) =
         *(uint *)((long)auStack_14a8 + *(long *)(_oss_indices + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_indices);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])0x211dc9,&indices_prefix,&local_1678);
    std::__cxx11::string::~string((string *)&local_1678);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indices);
    std::__cxx11::string::~string((string *)&indices_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCountOutput);
    std::__cxx11::string::~string((string *)&indexcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCapacityInput);
    std::__cxx11::string::~string((string *)&indexcapacityinput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexBlendWeights);
    std::__cxx11::string::~string((string *)&vertexblendweights_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexBlendIndices);
    std::__cxx11::string::~string((string *)&vertexblendindices_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexUVs);
    std::__cxx11::string::~string((string *)&vertexuvs_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexNormals);
    std::__cxx11::string::~string((string *)&vertexnormals_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexPositions);
    std::__cxx11::string::~string((string *)&vertexpositions_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCountOutput);
    std::__cxx11::string::~string((string *)&vertexcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCapacityInput);
    std::__cxx11::string::~string((string *)&vertexcapacityinput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointParents);
    std::__cxx11::string::~string((string *)&jointparents_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointRadii);
    std::__cxx11::string::~string((string *)&jointradii_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointBindPoses);
    std::__cxx11::string::~string((string *)&jointbindposes_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointCountOutput);
    std::__cxx11::string::~string((string *)&jointcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_jointCapacityInput);
    std::__cxx11::string::~string((string *)&jointcapacityinput_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandTrackingMeshFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string jointcapacityinput_prefix = prefix;
        jointcapacityinput_prefix += "jointCapacityInput";
        std::ostringstream oss_jointCapacityInput;
        oss_jointCapacityInput << "0x" << std::hex << (value->jointCapacityInput);
        contents.emplace_back("uint32_t", jointcapacityinput_prefix, oss_jointCapacityInput.str());
        std::string jointcountoutput_prefix = prefix;
        jointcountoutput_prefix += "jointCountOutput";
        std::ostringstream oss_jointCountOutput;
        oss_jointCountOutput << "0x" << std::hex << (value->jointCountOutput);
        contents.emplace_back("uint32_t", jointcountoutput_prefix, oss_jointCountOutput.str());
        std::string jointbindposes_prefix = prefix;
        jointbindposes_prefix += "jointBindPoses";
        std::ostringstream oss_jointBindPoses;
        oss_jointBindPoses << std::hex << reinterpret_cast<const void*>(value->jointBindPoses);
        contents.emplace_back("XrPosef*", jointbindposes_prefix, oss_jointBindPoses.str());
        std::string jointradii_prefix = prefix;
        jointradii_prefix += "jointRadii";
        std::ostringstream oss_jointRadii;
        oss_jointRadii << std::setprecision(32) << (value->jointRadii);
        contents.emplace_back("float*", jointradii_prefix, oss_jointRadii.str());
        std::string jointparents_prefix = prefix;
        jointparents_prefix += "jointParents";
        std::ostringstream oss_jointParents;
        oss_jointParents << std::hex << reinterpret_cast<const void*>(value->jointParents);
        contents.emplace_back("XrHandJointEXT*", jointparents_prefix, oss_jointParents.str());
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertexpositions_prefix = prefix;
        vertexpositions_prefix += "vertexPositions";
        std::ostringstream oss_vertexPositions;
        oss_vertexPositions << std::hex << reinterpret_cast<const void*>(value->vertexPositions);
        contents.emplace_back("XrVector3f*", vertexpositions_prefix, oss_vertexPositions.str());
        std::string vertexnormals_prefix = prefix;
        vertexnormals_prefix += "vertexNormals";
        std::ostringstream oss_vertexNormals;
        oss_vertexNormals << std::hex << reinterpret_cast<const void*>(value->vertexNormals);
        contents.emplace_back("XrVector3f*", vertexnormals_prefix, oss_vertexNormals.str());
        std::string vertexuvs_prefix = prefix;
        vertexuvs_prefix += "vertexUVs";
        std::ostringstream oss_vertexUVs;
        oss_vertexUVs << std::hex << reinterpret_cast<const void*>(value->vertexUVs);
        contents.emplace_back("XrVector2f*", vertexuvs_prefix, oss_vertexUVs.str());
        std::string vertexblendindices_prefix = prefix;
        vertexblendindices_prefix += "vertexBlendIndices";
        std::ostringstream oss_vertexBlendIndices;
        oss_vertexBlendIndices << std::hex << reinterpret_cast<const void*>(value->vertexBlendIndices);
        contents.emplace_back("XrVector4sFB*", vertexblendindices_prefix, oss_vertexBlendIndices.str());
        std::string vertexblendweights_prefix = prefix;
        vertexblendweights_prefix += "vertexBlendWeights";
        std::ostringstream oss_vertexBlendWeights;
        oss_vertexBlendWeights << std::hex << reinterpret_cast<const void*>(value->vertexBlendWeights);
        contents.emplace_back("XrVector4f*", vertexblendweights_prefix, oss_vertexBlendWeights.str());
        std::string indexcapacityinput_prefix = prefix;
        indexcapacityinput_prefix += "indexCapacityInput";
        std::ostringstream oss_indexCapacityInput;
        oss_indexCapacityInput << "0x" << std::hex << (value->indexCapacityInput);
        contents.emplace_back("uint32_t", indexcapacityinput_prefix, oss_indexCapacityInput.str());
        std::string indexcountoutput_prefix = prefix;
        indexcountoutput_prefix += "indexCountOutput";
        std::ostringstream oss_indexCountOutput;
        oss_indexCountOutput << "0x" << std::hex << (value->indexCountOutput);
        contents.emplace_back("uint32_t", indexcountoutput_prefix, oss_indexCountOutput.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices;
        oss_indices << std::hex << reinterpret_cast<const void*>(value->indices);
        contents.emplace_back("int16_t*", indices_prefix, oss_indices.str());
        return true;
    } catch(...) {
    }
    return false;
}